

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O2

bool __thiscall amrex::TagBoxArray::hasTags(TagBoxArray *this,Box *a_bx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  int iVar14;
  char *pcVar16;
  int i;
  long lVar17;
  int j;
  int iVar18;
  long lVar19;
  char *pcVar20;
  bool bVar21;
  MFIter mfi;
  Array4<const_char> local_d0;
  MFIter local_90;
  long lVar15;
  
  bVar21 = false;
  MFIter::MFIter(&local_90,(FabArrayBase *)this,'\0');
  while (local_90.currentIndex < local_90.endIndex) {
    MFIter::fabbox((Box *)&local_d0,&local_90);
    iVar12 = (int)local_d0.jstride;
    iVar11 = local_d0.p._4_4_;
    iVar10 = (int)local_d0.p;
    iVar1 = (a_bx->smallend).vect[0];
    iVar18 = (a_bx->smallend).vect[1];
    iVar14 = (a_bx->smallend).vect[2];
    iVar2 = (a_bx->bigend).vect[0];
    iVar3 = (a_bx->bigend).vect[1];
    iVar4 = (a_bx->bigend).vect[2];
    iVar5 = (int)local_d0.p;
    if ((int)local_d0.p < iVar1) {
      iVar5 = iVar1;
    }
    iVar6 = local_d0.p._4_4_;
    if (local_d0.p._4_4_ < iVar18) {
      iVar6 = iVar18;
    }
    iVar7 = (int)local_d0.jstride;
    if ((int)local_d0.jstride < iVar14) {
      iVar7 = iVar14;
    }
    iVar8 = local_d0.jstride._4_4_;
    if (iVar2 < local_d0.jstride._4_4_) {
      iVar8 = iVar2;
    }
    iVar2 = (int)local_d0.kstride;
    if (iVar3 < (int)local_d0.kstride) {
      iVar2 = iVar3;
    }
    iVar3 = local_d0.kstride._4_4_;
    if (iVar4 < local_d0.kstride._4_4_) {
      iVar3 = iVar4;
    }
    if ((((iVar5 <= iVar8) && (iVar6 <= iVar2)) && (iVar7 <= iVar3)) && ((a_bx->btype).itype < 8)) {
      FabArray<amrex::TagBox>::const_array<amrex::TagBox,_0>
                (&local_d0,&this->super_FabArray<amrex::TagBox>,&local_90);
      if (iVar1 < iVar10) {
        iVar1 = iVar10;
      }
      if (iVar18 < iVar11) {
        iVar18 = iVar11;
      }
      if (iVar14 < iVar12) {
        iVar14 = iVar12;
      }
      lVar15 = (long)iVar14;
      pcVar16 = (char *)((((lVar15 - local_d0.begin.z) *
                           CONCAT44(local_d0.kstride._4_4_,(int)local_d0.kstride) +
                          ((long)iVar18 - (long)local_d0.begin.y) *
                          CONCAT44(local_d0.jstride._4_4_,(int)local_d0.jstride) + (long)iVar1) -
                         (long)local_d0.begin.x) + CONCAT44(local_d0.p._4_4_,(int)local_d0.p));
      for (; pcVar13 = pcVar16, lVar19 = (long)iVar18, lVar15 <= iVar3; lVar15 = lVar15 + 1) {
        for (; lVar17 = (long)iVar1, pcVar20 = pcVar13, lVar19 <= iVar2; lVar19 = lVar19 + 1) {
          for (; lVar17 <= iVar8; lVar17 = lVar17 + 1) {
            bVar9 = !bVar21;
            bVar21 = true;
            if (bVar9) {
              bVar21 = *pcVar20 != '\0';
            }
            pcVar20 = pcVar20 + 1;
          }
          pcVar13 = pcVar13 + CONCAT44(local_d0.jstride._4_4_,(int)local_d0.jstride);
        }
        pcVar16 = pcVar16 + CONCAT44(local_d0.kstride._4_4_,(int)local_d0.kstride);
      }
    }
    MFIter::operator++(&local_90);
  }
  MFIter::~MFIter(&local_90);
  return bVar21;
}

Assistant:

bool
TagBoxArray::hasTags (Box const& a_bx) const
{
    bool has_tags = false;
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        ReduceOps<ReduceOpLogicalOr> reduce_op;
        ReduceData<int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;

        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            Box const& b = a_bx & mfi.fabbox();
            if (b.ok()) {
                const auto& arr = this->const_array(mfi);
                reduce_op.eval(b, reduce_data,
                [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
                {
                    int tr = arr(i,j,k) != TagBox::CLEAR;
                    return {tr};
                });
            }
        }

        ReduceTuple hv = reduce_data.value(reduce_op);
        has_tags = static_cast<bool>(amrex::get<0>(hv));
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(||:has_tags)
#endif
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            Box const& b = a_bx & mfi.fabbox();
            if (b.ok()) {
                Array4<char const> const& arr = this->const_array(mfi);
                AMREX_LOOP_3D(b, i, j, k,
                {
                    has_tags = has_tags || (arr(i,j,k) != TagBox::CLEAR);
                });
            }
        }
    }

    ParallelAllReduce::Or(has_tags, ParallelContext::CommunicatorSub());
    return has_tags;
}